

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.hpp
# Opt level: O0

string * format_error<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>&>
                   (string *__return_storage_ptr__,Options *opt,char *type,TokenInfo *context,
                   char *msg,basic_string_view<char,_std::char_traits<char>_> *args)

{
  TokenInfo *type_00;
  char *pcVar1;
  char *filename;
  optional<const_TokenStream::TextStream_&> local_90;
  tuple<unsigned_long&,unsigned_long&> local_88 [16];
  pair<unsigned_long,_unsigned_long> local_78;
  long local_68;
  size_t length;
  size_t colno;
  size_t lineno;
  optional<const_TokenStream::TextStream_&> local_48;
  basic_string_view<char,_std::char_traits<char>_> *local_40;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  char *msg_local;
  TokenInfo *context_local;
  char *type_local;
  Options *opt_local;
  
  local_40 = args;
  args_local = (basic_string_view<char,_std::char_traits<char>_> *)msg;
  msg_local = (char *)context;
  context_local = (TokenInfo *)type;
  type_local = &opt->help;
  opt_local = (Options *)__return_storage_ptr__;
  if (context->begin == context->end) {
    std::experimental::optional<const_TokenStream::TextStream_&>::optional(&local_48);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    format_error<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>&>
              (__return_storage_ptr__,opt,type,&local_48,pcVar1,0,0,0,(char *)args_local,local_40);
  }
  else {
    local_68 = context->end - context->begin;
    local_78 = TokenStream::TextStream::linecol_from_offset(context->stream,context->begin);
    std::tie<unsigned_long,unsigned_long>((unsigned_long *)local_88,&colno);
    std::tuple<unsigned_long&,unsigned_long&>::operator=(local_88,&local_78);
    pcVar1 = type_local;
    type_00 = context_local;
    std::experimental::optional<const_TokenStream::TextStream_&>::optional
              (&local_90,*(TextStream **)msg_local);
    filename = (char *)std::__cxx11::string::c_str();
    format_error<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>&>
              (__return_storage_ptr__,(Options *)pcVar1,(char *)type_00,&local_90,filename,
               (uint32_t)colno,(uint32_t)length,(uint32_t)local_68,(char *)args_local,local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string format_error(const Options& opt, const char* type, const TokenStream::TokenInfo& context, const char* msg, Args&&... args)
{
    if(context.begin == context.end)
    {
        return format_error(opt, type, nullopt, context.stream.stream_name.c_str(), 0, 0, 0,
                            msg, std::forward<Args>(args)...);
    }
    else
    {
        size_t lineno, colno;
        size_t length = context.end - context.begin;
        std::tie(lineno, colno) = context.stream.linecol_from_offset(context.begin);
        return format_error(opt, type, context.stream, context.stream.stream_name.c_str(), lineno, colno, length,
                            msg, std::forward<Args>(args)...);
    }
}